

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O0

void __thiscall
nuraft::peer::handle_rpc_result
          (peer *this,ptr<peer> *myself,ptr<rpc_client> *my_rpc_client,ptr<req_msg> *req,
          ptr<rpc_result> *pending_result,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  initializer_list<int> __l;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  __shared_ptr *in_RCX;
  __shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  long in_RDI;
  __shared_ptr *in_stack_00000008;
  uint64_t given_rpc_id_1;
  uint64_t cur_rpc_id_1;
  lock_guard<std::mutex> l_1;
  ptr<resp_msg> no_resp;
  lock_guard<std::mutex> guard_1;
  ptr<rpc_exception> no_except;
  lock_guard<std::mutex> guard;
  uint64_t given_rpc_id;
  uint64_t cur_rpc_id;
  lock_guard<std::mutex> l;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *in_stack_fffffffffffffd28;
  resp_msg *in_stack_fffffffffffffd30;
  key_equal *in_stack_fffffffffffffd38;
  cmd_result_code code;
  long lVar14;
  peer *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
  *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  size_type in_stack_fffffffffffffd60;
  allocator_type *in_stack_fffffffffffffd70;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_238;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_228;
  char *local_218;
  string local_1c8 [32];
  _Node_iterator_base<int,_false> local_1a8;
  msg_type local_19c;
  _Node_iterator_base<int,_false> local_198;
  long local_190;
  long local_188;
  msg_type in_stack_fffffffffffffe9c;
  _Node_iterator_base<int,_false> local_138;
  msg_type local_12c;
  _Node_iterator_base<int,_false> local_128;
  int local_11c;
  string local_118 [32];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_f8;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_f0;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [53];
  undefined1 local_6b [75];
  __shared_ptr *local_20;
  
  local_20 = in_RCX;
  if ((handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
       ::msg_types_to_free == '\0') &&
     (iVar3 = __cxa_guard_acquire(&handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
                                   ::msg_types_to_free), iVar3 != 0)) {
    local_6b._19_8_ = 0x1c0000000e;
    local_6b._27_8_ = 0x180000001a;
    local_6b._3_8_ = 0x1000000003;
    local_6b._11_8_ = 0x1400000001;
    local_6b._43_8_ = local_6b + 3;
    local_6b._51_8_ = 8;
    in_stack_fffffffffffffd28 =
         (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)local_6b;
    std::allocator<int>::allocator((allocator<int> *)0x13f1f0);
    __l._M_array._4_4_ = in_stack_fffffffffffffd5c;
    __l._M_array._0_4_ = in_stack_fffffffffffffd58;
    __l._M_len = in_stack_fffffffffffffd60;
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               in_stack_fffffffffffffd50,__l,
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (hasher *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd70);
    std::allocator<int>::~allocator((allocator<int> *)0x13f23d);
    __cxa_atexit(std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                 ~unordered_set,&handle_rpc_result::msg_types_to_free,&__dso_handle);
    __cxa_guard_release(&handle_rpc_result(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)
                         ::msg_types_to_free);
  }
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd38);
  code = (cmd_result_code)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
    if (bVar2) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x13f2b1);
      iVar3 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (3 < iVar3) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13f2d7);
        peVar11 = std::
                  __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13f2ec);
        uVar5 = srv_config::get_id(peVar11);
        msg_if_given_abi_cxx11_
                  ((char *)local_a0,"peer %d has been shut down, ignore response.",(ulong)uVar5);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"handle_rpc_result",0x62,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_20);
    if ((bVar2) &&
       (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0)), bVar2))
    {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x13f3fb);
      iVar3 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (5 < iVar3) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13f421);
        peVar9 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13f436);
        uVar5 = msg_base::get_src(&peVar9->super_msg_base);
        peVar9 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13f452);
        uVar4 = msg_base::get_dst(&peVar9->super_msg_base);
        peVar9 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13f46e);
        msg_base::get_type(&peVar9->super_msg_base);
        msg_type_to_string_abi_cxx11_(in_stack_fffffffffffffe9c);
        uVar6 = std::__cxx11::string::c_str();
        bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_00000008);
        if (bVar2) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x13f4ba);
          local_218 = (char *)(**(code **)(*(long *)peVar7 + 0x10))();
        }
        else {
          local_218 = "OK";
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_c0,"resp of req %d -> %d, type %s, %s",(ulong)uVar5,(ulong)uVar4,
                   uVar6,local_218);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"handle_rpc_result",0x6b,local_c0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string(local_e0);
      }
    }
    bVar2 = std::operator==((shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffd30,
                            in_stack_fffffffffffffd28);
    if (bVar2) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,
                 (mutex_type *)in_stack_fffffffffffffd28);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13f60a);
        local_228 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    (**(code **)(*(long *)peVar8 + 0x18))();
      }
      else {
        local_228 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    0x0;
      }
      local_f0 = local_228;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDX);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13f66e);
        local_238 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    (**(code **)(*(long *)peVar8 + 0x18))();
      }
      else {
        local_238 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    0x0;
      }
      local_f8 = local_238;
      if (local_f0 == local_238) {
        peVar9 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13f86d);
        local_12c = msg_base::get_type(&peVar9->super_msg_base);
        local_128._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                       (in_stack_fffffffffffffd28,(key_type *)0x13f89a);
        local_138._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                       (in_stack_fffffffffffffd28);
        bVar2 = std::__detail::operator!=(&local_128,&local_138);
        if (bVar2) {
          set_free((peer *)0x13f8ea);
        }
        local_11c = 0;
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
        if (bVar2) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13f6f9);
          iVar3 = (**(code **)(*(long *)peVar10 + 0x38))();
          if (2 < iVar3) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x13f732);
            peVar11 = std::
                      __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x13f747);
            uVar5 = srv_config::get_id(peVar11);
            peVar12 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                                 (in_RDI + 0x20));
            puVar1 = local_f0;
            peVar13 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get(in_RDX)
            ;
            in_stack_fffffffffffffd28 = local_f8;
            msg_if_given_abi_cxx11_
                      ((char *)local_118,
                       "[EDGE CASE] got stale RPC response from %d: current %p (%lu), from parameter %p (%lu). will ignore this response"
                       ,(ulong)uVar5,peVar12,puVar1,peVar13);
            (**(code **)(*(long *)peVar10 + 0x40))
                      (peVar10,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                       ,"handle_rpc_result",0x7d,local_118);
            std::__cxx11::string::~string(local_118);
          }
        }
        local_11c = 1;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13f906);
      if (local_11c == 0) {
        reset_active_timer((peer *)0x13f925);
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,
                   (mutex_type *)in_stack_fffffffffffffd28);
        resume_hb_speed((peer *)0x13f94e);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13f95d);
        std::shared_ptr<nuraft::rpc_exception>::shared_ptr
                  ((shared_ptr<nuraft::rpc_exception> *)0x13f96a);
        std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13f977);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd30,
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd28);
        resp_msg::set_peer(in_stack_fffffffffffffd30,(ptr<peer> *)in_stack_fffffffffffffd28);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x13f9b4);
        std::
        __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x13f9c1);
        cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
        set_result(in_stack_fffffffffffffd50,
                   (shared_ptr<nuraft::resp_msg> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffd40,code);
        timer_helper::reset((timer_helper *)in_stack_fffffffffffffd40);
        timer_helper::set_duration_ms
                  ((timer_helper *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
        std::shared_ptr<nuraft::rpc_exception>::~shared_ptr
                  ((shared_ptr<nuraft::rpc_exception> *)0x13fa1b);
      }
    }
    else {
      reset_active_timer((peer *)0x13faae);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,
                 (mutex_type *)in_stack_fffffffffffffd28);
      slow_down_hb(in_stack_fffffffffffffd40);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13fae6);
      std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x13faf8);
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13fb05);
      cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
      set_result(in_stack_fffffffffffffd50,
                 (shared_ptr<nuraft::resp_msg> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 (shared_ptr<nuraft::rpc_exception> *)in_stack_fffffffffffffd40,code);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffd30,
                 (mutex_type *)in_stack_fffffffffffffd28);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13fb61);
        local_188 = (**(code **)(*(long *)peVar8 + 0x18))();
      }
      else {
        local_188 = 0;
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDX);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13fbb6);
        local_190 = (**(code **)(*(long *)peVar8 + 0x18))();
      }
      else {
        local_190 = 0;
      }
      if (local_188 == local_190) {
        std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                   in_stack_fffffffffffffd40);
        peVar9 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13fc1f);
        local_19c = msg_base::get_type(&peVar9->super_msg_base);
        local_198._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                       (in_stack_fffffffffffffd28,(key_type *)0x13fc4c);
        local_1a8._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                       (in_stack_fffffffffffffd28);
        bVar2 = std::__detail::operator!=(&local_198,&local_1a8);
        if (bVar2) {
          set_free((peer *)0x13fc9c);
        }
      }
      else {
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
        if (bVar2) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x13fd2e);
          iVar3 = (**(code **)(*(long *)peVar10 + 0x38))();
          if (2 < iVar3) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x13fd61);
            peVar11 = std::
                      __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x13fd73);
            uVar5 = srv_config::get_id(peVar11);
            peVar12 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
                                 (in_RDI + 0x20));
            lVar14 = local_188;
            peVar13 = std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::get(in_RDX)
            ;
            msg_if_given_abi_cxx11_
                      ((char *)local_1c8,
                       "[EDGE CASE] RPC for %d has been reset before returning error: current %p (%lu), from parameter %p (%lu)"
                       ,(ulong)uVar5,peVar12,lVar14,peVar13,local_190);
            (**(code **)(*(long *)peVar10 + 0x40))
                      (peVar10,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                       ,"handle_rpc_result",0xb9,local_1c8);
            std::__cxx11::string::~string(local_1c8);
          }
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13fe5a);
      std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x13fe67);
    }
  }
  return;
}

Assistant:

void peer::handle_rpc_result( ptr<peer> myself,
                              ptr<rpc_client> my_rpc_client,
                              ptr<req_msg>& req,
                              ptr<rpc_result>& pending_result,
                              ptr<resp_msg>& resp,
                              ptr<rpc_exception>& err )
{
    const static std::unordered_set<int> msg_types_to_free( {
        msg_type::append_entries_request,
        msg_type::install_snapshot_request,
        msg_type::request_vote_request,
        msg_type::pre_vote_request,
        msg_type::leave_cluster_request,
        msg_type::custom_notification_request,
        msg_type::reconnect_request,
        msg_type::priority_change_request
    } );

    if (abandoned_) {
        p_in("peer %d has been shut down, ignore response.", config_->get_id());
        return;
    }

    if (req) {
        p_tr( "resp of req %d -> %d, type %s, %s",
              req->get_src(),
              req->get_dst(),
              msg_type_to_string( req->get_type() ).c_str(),
              (err) ? err->what() : "OK" );
    }

    if (err == nilptr) {
        // Succeeded.
        {   std::lock_guard<std::mutex> l(rpc_protector_);
            // The same as below, freeing busy flag should be done
            // only if the RPC hasn't been changed.
            uint64_t cur_rpc_id = rpc_ ? rpc_->get_id() : 0;
            uint64_t given_rpc_id = my_rpc_client ? my_rpc_client->get_id() : 0;
            if (cur_rpc_id != given_rpc_id) {
                p_wn( "[EDGE CASE] got stale RPC response from %d: "
                      "current %p (%" PRIu64 "), from parameter %p (%" PRIu64 "). "
                      "will ignore this response",
                      config_->get_id(),
                      rpc_.get(),
                      cur_rpc_id,
                      my_rpc_client.get(),
                      given_rpc_id );
                return;
            }
            // WARNING:
            //   `set_free()` should be protected by `rpc_protector_`, otherwise
            //   it may free the peer even though new RPC client is already created.
            if ( msg_types_to_free.find(req->get_type()) != msg_types_to_free.end() ) {
                set_free();
            }
        }

        reset_active_timer();
        {
            auto_lock(lock_);
            resume_hb_speed();
        }
        ptr<rpc_exception> no_except;
        resp->set_peer(myself);
        pending_result->set_result(resp, no_except);

        reconn_backoff_.reset();
        reconn_backoff_.set_duration_ms(1);

    } else {
        // Failed.

        // NOTE: Explicit failure is also treated as an activity
        //       of that connection.
        reset_active_timer();
        {
            auto_lock(lock_);
            slow_down_hb();
        }
        ptr<resp_msg> no_resp;
        pending_result->set_result(no_resp, err);

        // Destroy this connection, we MUST NOT re-use existing socket.
        // Next append operation will create a new one.
        {   std::lock_guard<std::mutex> l(rpc_protector_);
            uint64_t cur_rpc_id = rpc_ ? rpc_->get_id() : 0;
            uint64_t given_rpc_id = my_rpc_client ? my_rpc_client->get_id() : 0;
            if (cur_rpc_id == given_rpc_id) {
                rpc_.reset();
                if ( msg_types_to_free.find(req->get_type()) !=
                         msg_types_to_free.end() ) {
                    set_free();
                }

            } else {
                // WARNING (MONSTOR-9378):
                //   RPC client has been reset before this request returns
                //   error. Those two are different instances and we
                //   SHOULD NOT reset the new one.
                p_wn( "[EDGE CASE] RPC for %d has been reset before "
                      "returning error: current %p (%" PRIu64
                      "), from parameter %p (%" PRIu64 ")",
                      config_->get_id(),
                      rpc_.get(),
                      cur_rpc_id,
                      my_rpc_client.get(),
                      given_rpc_id );
            }
        }
    }
}